

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton.h
# Opt level: O0

void es::init::empty_stack(void)

{
  _func_void *p_Var1;
  singletons_meta_data *psVar2;
  _func_void *f;
  singletons_meta_data *p;
  uint64_t n;
  undefined8 in_stack_ffffffffffffffe8;
  atomic<bool> *in_stack_fffffffffffffff0;
  
  std::atomic<bool>::operator=
            (in_stack_fffffffffffffff0,SUB81((ulong)in_stack_ffffffffffffffe8 >> 0x38,0));
  while (psVar2 = static_obj_stack<es::init::singletons_meta_data>::pop(),
        psVar2 != (singletons_meta_data *)0x0) {
    p_Var1 = psVar2->_func;
    if (p_Var1 != (_func_void *)0x0) {
      psVar2->_func = (_func_void *)0x0;
      (*p_Var1)();
    }
  }
  return;
}

Assistant:

inline void empty_stack()
{
    clean_up_phase = true;

    uint64_t n{0};
    while (auto p = stack::pop())
    {
        if constexpr (es::init::verbose_singletons)
        {
            std::cout << "empty_stack[" << n << "]: " << *p << std::endl;
            ++n;
        }
        if (auto f = p->_func)
        {
            p->_func = nullptr;
            f();
        }
    }
}